

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

void UA_NodeStore_delete(UA_NodeStore *ns)

{
  uint uVar1;
  UA_NodeStoreEntry **ppUVar2;
  uint local_24;
  UA_UInt32 i;
  UA_NodeStoreEntry **entries;
  UA_UInt32 size;
  UA_NodeStore *ns_local;
  
  uVar1 = ns->size;
  ppUVar2 = ns->entries;
  for (local_24 = 0; local_24 < uVar1; local_24 = local_24 + 1) {
    if ((UA_NodeStoreEntry *)0x1 < ppUVar2[local_24]) {
      deleteEntry(ppUVar2[local_24]);
    }
  }
  free(ns->entries);
  free(ns);
  return;
}

Assistant:

void
UA_NodeStore_delete(UA_NodeStore *ns) {
    UA_UInt32 size = ns->size;
    UA_NodeStoreEntry **entries = ns->entries;
    for(UA_UInt32 i = 0; i < size; ++i) {
        if(entries[i] > UA_NODESTORE_TOMBSTONE)
            deleteEntry(entries[i]);
    }
    UA_free(ns->entries);
    UA_free(ns);
}